

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedAllMips::Setup(AdvancedAllMips *this)

{
  GLuint GVar1;
  char *glsl_load_fs;
  char *glsl_store_fs;
  char *glsl_vs;
  AdvancedAllMips *this_local;
  
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_texture);
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,&this->m_ebo);
  GVar1 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(rgba32f) uniform image2D g_image[6];\nvoid main() {\n  for (int i = 0; i < 6; ++i) {\n    imageStore(g_image[i], ivec2(gl_FragCoord), vec4(i));\n  }\n  discard;\n}"
                     ,(bool *)0x0);
  this->m_store_program = GVar1;
  GVar1 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) uniform image2D g_image[6];\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  for (int i = 0; i < 6; ++i) {\n    const ivec2 coord = ivec2(gl_FragCoord);\n    const vec4 c = imageLoad(g_image[i], coord);\n    if (c != vec4(i) && c != vec4(0.0)) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  }\n}"
                     ,(bool *)0x0);
  this->m_load_program = GVar1;
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenTextures(1, &m_texture);
		CreateFullViewportQuad(&m_vao, &m_vbo, &m_ebo);

		const char* const glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
									"void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* const glsl_store_fs =
			"#version 420 core" NL "layout(rgba32f) uniform image2D g_image[6];" NL "void main() {" NL
			"  for (int i = 0; i < 6; ++i) {" NL "    imageStore(g_image[i], ivec2(gl_FragCoord), vec4(i));" NL "  }" NL
			"  discard;" NL "}";
		const char* const glsl_load_fs =
			"#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(rgba32f) uniform image2D g_image[6];" NL "void main() {" NL
			"  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "  for (int i = 0; i < 6; ++i) {" NL
			"    const ivec2 coord = ivec2(gl_FragCoord);" NL "    const vec4 c = imageLoad(g_image[i], coord);" NL
			"    if (c != vec4(i) && c != vec4(0.0)) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL "  }" NL "}";
		m_store_program = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_store_fs);
		m_load_program  = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_load_fs);

		return NO_ERROR;
	}